

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwobjects.h
# Opt level: O1

void __thiscall rw::ObjectWithFrame::setFrame(ObjectWithFrame *this,Frame *f)

{
  LLLink *pLVar1;
  
  if ((this->object).parent != (void *)0x0) {
    pLVar1 = (this->inFrame).prev;
    pLVar1->next = (this->inFrame).next;
    ((this->inFrame).next)->prev = pLVar1;
  }
  (this->object).parent = f;
  if (f != (Frame *)0x0) {
    (this->inFrame).next = (f->objectList).link.next;
    (this->inFrame).prev = &(f->objectList).link;
    ((f->objectList).link.next)->prev = &this->inFrame;
    (f->objectList).link.next = &this->inFrame;
    Frame::updateObjects(f);
    return;
  }
  return;
}

Assistant:

void setFrame(Frame *f){
		if(this->object.parent)
			this->inFrame.remove();
		this->object.parent = f;
		if(f){
			f->objectList.add(&this->inFrame);
			f->updateObjects();
		}
	}